

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  powerpc_test_cpu *this;
  FILE *__stream;
  char *__s1;
  
  this = (powerpc_test_cpu *)operator_new(0x248);
  powerpc_test_cpu::powerpc_test_cpu(this);
  if (argc < 2) {
LAB_00106f94:
    fwrite("ERROR: a results file for reference is required\n",0x30,1,_stderr);
  }
  else {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"--jit");
    if (iVar2 == 0) {
      argv[1] = *argv;
      if (argc == 2) goto LAB_00106f94;
      __s1 = argv[2];
    }
    __stream = fopen(__s1,"rb");
    if (__stream != (FILE *)0x0) {
      this->results_file = (FILE *)__stream;
      setvbuf(__stream,main::buffer,0,0x1000);
      bVar1 = powerpc_test_cpu::test(this);
      fclose(__stream);
      powerpc_test_cpu::~powerpc_test_cpu(this);
      operator_delete(this,0x248);
      return (uint)!bVar1;
    }
    fprintf(_stderr,"ERROR: can\'t open %s for reading\n",__s1);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef EMU_KHEPERIX
	// Initialize VM system (predecode cache uses vm_acquire())
	vm_init();
#endif

	FILE *fp = NULL;
	powerpc_test_cpu *ppc = new powerpc_test_cpu;

	if (argc > 1) {
		const char *arg = argv[1];
		if (strcmp(arg, "--jit") == 0) {
			--argc;
			argv[1] = argv[0];
			++argv;
			ppc->enable_jit();
		}
	}

	if (argc > 1) {
		const char *file = argv[1];
#ifdef NATIVE_POWERPC
		if ((fp = fopen(file, "wb")) == NULL) {
			fprintf(stderr, "ERROR: can't open %s for writing\n", file);
			return EXIT_FAILURE;
		}
#else
		if ((fp = fopen(file, "rb")) == NULL) {
			fprintf(stderr, "ERROR: can't open %s for reading\n", file);
			return EXIT_FAILURE;
		}
#endif
		ppc->set_results_file(fp);

		// Use a large enough buffer
		static char buffer[4096];
		setvbuf(fp, buffer, _IOFBF, sizeof(buffer));
	}

	// We need a results file on non PowerPC platforms
#ifndef NATIVE_POWERPC
	if (fp == NULL) {
		fprintf(stderr, "ERROR: a results file for reference is required\n");
		return EXIT_FAILURE;
	}
#endif

	// Check if host CPU supports AltiVec instructions
	has_altivec = true;
#ifdef NATIVE_POWERPC
	signal(SIGILL, sigill_handler);
	if (!sigsetjmp(env, 1))
		asm volatile(".long 0x10000484"); // vor v0,v0,v0
	signal(SIGILL, SIG_DFL);
#endif

	bool ok = ppc->test();
	if (fp) fclose(fp);
	delete ppc;
	return !ok;
}